

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswConstr.c
# Opt level: O0

int Ssw_ManSweepNodeConstr(Ssw_Man_t *p,Aig_Obj_t *pObj,int f,int fBmc)

{
  ulong uVar1;
  ulong uVar2;
  int iVar3;
  int iVar4;
  Aig_Obj_t *pAVar5;
  Aig_Obj_t *pAVar6;
  Aig_Obj_t *pObj_00;
  Aig_Obj_t *pAVar7;
  Aig_Obj_t *pAVar8;
  int local_4c;
  int RetValue;
  Aig_Obj_t *pObjReprFraig;
  Aig_Obj_t *pObjFraig2;
  Aig_Obj_t *pObjFraig;
  Aig_Obj_t *pObjRepr;
  int fBmc_local;
  int f_local;
  Aig_Obj_t *pObj_local;
  Ssw_Man_t *p_local;
  
  pAVar5 = Aig_ObjRepr(p->pAig,pObj);
  if (pAVar5 == (Aig_Obj_t *)0x0) {
    p_local._4_4_ = 0;
  }
  else {
    pAVar6 = Ssw_ObjFrame(p,pObj,f);
    pObj_00 = Ssw_ObjFrame(p,pAVar5,f);
    if ((pAVar6 == (Aig_Obj_t *)0x0) || (pObj_00 == (Aig_Obj_t *)0x0)) {
      __assert_fail("pObjFraig != NULL && pObjReprFraig != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/ssw/sswConstr.c"
                    ,0x147,"int Ssw_ManSweepNodeConstr(Ssw_Man_t *, Aig_Obj_t *, int, int)");
    }
    uVar1 = *(ulong *)&pObj->field_0x18;
    uVar2 = *(ulong *)&pAVar5->field_0x18;
    iVar3 = Aig_ObjPhaseReal(pAVar6);
    iVar4 = Aig_ObjPhaseReal(pObj_00);
    if ((((uint)(uVar1 >> 3) & 1) == ((uint)(uVar2 >> 3) & 1)) != (iVar3 == iVar4)) {
      __assert_fail("(pObj->fPhase == pObjRepr->fPhase) == (Aig_ObjPhaseReal(pObjFraig) == Aig_ObjPhaseReal(pObjReprFraig))"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/ssw/sswConstr.c"
                    ,0x148,"int Ssw_ManSweepNodeConstr(Ssw_Man_t *, Aig_Obj_t *, int, int)");
    }
    pAVar7 = Aig_Regular(pAVar6);
    pAVar8 = Aig_Regular(pObj_00);
    if (pAVar7 == pAVar8) {
      p_local._4_4_ = 0;
    }
    else {
      pAVar7 = Aig_Regular(pAVar6);
      pAVar8 = Aig_ManConst1(p->pFrames);
      if (pAVar7 == pAVar8) {
        pAVar6 = Aig_Regular(pAVar6);
        pAVar7 = Aig_Regular(pObj_00);
        local_4c = Ssw_NodesAreEquiv(p,pAVar6,pAVar7);
      }
      else {
        pAVar7 = Aig_Regular(pObj_00);
        pAVar6 = Aig_Regular(pAVar6);
        local_4c = Ssw_NodesAreEquiv(p,pAVar7,pAVar6);
      }
      if (local_4c == 1) {
        pAVar5 = Aig_NotCond(pObj_00,(uint)(*(ulong *)&pObj->field_0x18 >> 3) & 1 ^
                                     (uint)(*(ulong *)&pAVar5->field_0x18 >> 3) & 1);
        Ssw_ObjSetFrame(p,pObj,f,pAVar5);
        p_local._4_4_ = 0;
      }
      else if (local_4c == -1) {
        Ssw_ClassesRemoveNode(p->ppClasses,pObj);
        p_local._4_4_ = 1;
      }
      else {
        Ssw_SmlSavePatternAig(p,f);
        Ssw_ManResimulateBit(p,pObj,pAVar5);
        pAVar6 = Aig_ObjRepr(p->pAig,pObj);
        if (pAVar6 == pAVar5) {
          __assert_fail("Aig_ObjRepr( p->pAig, pObj ) != pObjRepr",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/ssw/sswConstr.c"
                        ,0x15f,"int Ssw_ManSweepNodeConstr(Ssw_Man_t *, Aig_Obj_t *, int, int)");
        }
        pAVar6 = Aig_ObjRepr(p->pAig,pObj);
        if (pAVar6 == pAVar5) {
          Abc_Print(1,"Ssw_ManSweepNodeConstr(): Failed to refine representative.\n");
        }
        p_local._4_4_ = 1;
      }
    }
  }
  return p_local._4_4_;
}

Assistant:

int Ssw_ManSweepNodeConstr( Ssw_Man_t * p, Aig_Obj_t * pObj, int f, int fBmc )
{
    Aig_Obj_t * pObjRepr, * pObjFraig, * pObjFraig2, * pObjReprFraig;
    int RetValue;
    // get representative of this class
    pObjRepr = Aig_ObjRepr( p->pAig, pObj );
    if ( pObjRepr == NULL )
        return 0;
    // get the fraiged node
    pObjFraig = Ssw_ObjFrame( p, pObj, f );
    // get the fraiged representative
    pObjReprFraig = Ssw_ObjFrame( p, pObjRepr, f );
    // check if constant 0 pattern distinquishes these nodes
    assert( pObjFraig != NULL && pObjReprFraig != NULL );
    assert( (pObj->fPhase == pObjRepr->fPhase) == (Aig_ObjPhaseReal(pObjFraig) == Aig_ObjPhaseReal(pObjReprFraig)) );
    // if the fraiged nodes are the same, return
    if ( Aig_Regular(pObjFraig) == Aig_Regular(pObjReprFraig) )
        return 0;
    // call equivalence checking
    if ( Aig_Regular(pObjFraig) != Aig_ManConst1(p->pFrames) )
        RetValue = Ssw_NodesAreEquiv( p, Aig_Regular(pObjReprFraig), Aig_Regular(pObjFraig) );
    else
        RetValue = Ssw_NodesAreEquiv( p, Aig_Regular(pObjFraig), Aig_Regular(pObjReprFraig) );
    if ( RetValue == 1 )  // proved equivalent
    {
        pObjFraig2 = Aig_NotCond( pObjReprFraig, pObj->fPhase ^ pObjRepr->fPhase );
        Ssw_ObjSetFrame( p, pObj, f, pObjFraig2 );
        return 0;
    }
    if ( RetValue == -1 ) // timed out
    {
        Ssw_ClassesRemoveNode( p->ppClasses, pObj );
        return 1;
    }
    // disproved equivalence
    Ssw_SmlSavePatternAig( p, f );
    Ssw_ManResimulateBit( p, pObj, pObjRepr );
    assert( Aig_ObjRepr( p->pAig, pObj ) != pObjRepr );
    if ( Aig_ObjRepr( p->pAig, pObj ) == pObjRepr )
    {
        Abc_Print( 1, "Ssw_ManSweepNodeConstr(): Failed to refine representative.\n" );
    }
    return 1;
}